

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::AnimatedLightNode::AnimatedLightNode
          (AnimatedLightNode *this,
          vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          *lights,BBox1f time_range)

{
  LightNode::LightNode(&this->super_LightNode);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AnimatedLightNode_002a7c58;
  std::
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  ::vector(&this->lights,lights);
  this->time_range = time_range;
  return;
}

Assistant:

AnimatedLightNode (const std::vector<Ref<LightNode>>&& lights, BBox1f time_range)
        : lights(lights), time_range(time_range) {}